

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void sysbvm_array_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_array_primitive_equals,"Array::=");
  sysbvm_primitiveTable_registerFunction(sysbvm_array_primitive_hash,"Array::hash");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_copyFromUntil,"ByteArray::copyFrom:until:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_replaceBytesFromWith,
             "ByteArray::replaceBytesFrom:count:with:startingAt:");
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char8At,"ByteArray::char8At:");
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint8At,"ByteArray::uint8At:");
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int8At,"ByteArray::int8At:");
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char16At,"ByteArray::char16At:")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint16At,"ByteArray::uint16At:")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int16At,"ByteArray::int16At:");
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char32At,"ByteArray::char32At:")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint32At,"ByteArray::uint32At:")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int32At,"ByteArray::int32At:");
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint64At,"ByteArray::uint64At:")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int64At,"ByteArray::int64At:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_float32At,"ByteArray::float32At:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_float64At,"ByteArray::float64At:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_char8AtPut,"ByteArray::char8At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_uint8AtPut,"ByteArray::uint8At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_int8AtPut,"ByteArray::int8At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_char16AtPut,"ByteArray::char16At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_uint16AtPut,"ByteArray::uint16At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_int16AtPut,"ByteArray::int16At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_char32AtPut,"ByteArray::char32At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_uint32AtPut,"ByteArray::uint32At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_int32AtPut,"ByteArray::int32At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_uint64AtPut,"ByteArray::uint64At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_int64AtPut,"ByteArray::int64At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_float32AtPut,"ByteArray::float32At:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_byteArray_primitive_float64AtPut,"ByteArray::float64At:put:");
  return;
}

Assistant:

void sysbvm_array_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_array_primitive_equals, "Array::=");
    sysbvm_primitiveTable_registerFunction(sysbvm_array_primitive_hash, "Array::hash");

    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_copyFromUntil, "ByteArray::copyFrom:until:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_replaceBytesFromWith, "ByteArray::replaceBytesFrom:count:with:startingAt:");

    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char8At, "ByteArray::char8At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint8At, "ByteArray::uint8At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int8At , "ByteArray::int8At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char16At, "ByteArray::char16At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint16At, "ByteArray::uint16At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int16At , "ByteArray::int16At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char32At, "ByteArray::char32At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint32At, "ByteArray::uint32At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int32At , "ByteArray::int32At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint64At, "ByteArray::uint64At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int64At , "ByteArray::int64At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_float32At , "ByteArray::float32At:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_float64At , "ByteArray::float64At:");

    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char8AtPut, "ByteArray::char8At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint8AtPut, "ByteArray::uint8At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int8AtPut , "ByteArray::int8At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char16AtPut, "ByteArray::char16At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint16AtPut, "ByteArray::uint16At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int16AtPut , "ByteArray::int16At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_char32AtPut, "ByteArray::char32At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint32AtPut, "ByteArray::uint32At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int32AtPut , "ByteArray::int32At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_uint64AtPut, "ByteArray::uint64At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_int64AtPut , "ByteArray::int64At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_float32AtPut , "ByteArray::float32At:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_byteArray_primitive_float64AtPut , "ByteArray::float64At:put:");
}